

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall CDirectivePosition::exec(CDirectivePosition *this)

{
  if (this->type == Virtual) {
    FileManager::seekVirtual(g_fileManager,(ulong)(uint)this->position);
    return;
  }
  if (this->type == Physical) {
    FileManager::seekPhysical(g_fileManager,(ulong)(uint)this->position);
    return;
  }
  return;
}

Assistant:

void CDirectivePosition::exec()
{
	switch (type)
	{
	case Physical:
		g_fileManager->seekPhysical((u32)position);
		break;
	case Virtual:
		g_fileManager->seekVirtual((u32)position);
		break;
	}
}